

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::BuildEngineTest_discoveredDependencies_Test::TestBody()::
TaskWithDiscoveredDependency::inputsAvailable(llbuild::core::TaskInterface_
          (void *this,TaskInterface ti)

{
  ValueType local_58;
  KeyType local_40;
  void *local_20;
  TaskWithDiscoveredDependency *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (TaskWithDiscoveredDependency *)ti.impl;
  local_20 = this;
  llbuild::core::KeyType::KeyType(&local_40,"value-B");
  llbuild::core::TaskInterface::discoveredDependency((TaskInterface *)&this_local,&local_40);
  llbuild::core::KeyType::~KeyType(&local_40);
  anon_unknown.dwarf_1e0a3::intToValue
            (&local_58,*(int *)((long)this + 0x10) * **(int **)((long)this + 8) * 5);
  llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_58,false);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_58);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
      // Report the discovered dependency.
      ti.discoveredDependency("value-B");
      ti.complete(intToValue(computedInputValue * valueB * 5));
    }